

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O1

bool __thiscall TestClass::SyncRetFunc0(TestClass *this)

{
  char cVar1;
  SyncRetEventAgent<bool> *this_00;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  cVar1 = EventDispatcher::isThreadCurrent();
  if (cVar1 != '\0') {
    return true;
  }
  this_00 = (SyncRetEventAgent<bool> *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0xe9);
  *(undefined4 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->field_0xc = 0xfffffffb;
  *(undefined ***)this_00 = &PTR_onRefCountZero_001109b8;
  *(TestClass **)(this_00 + 1) = this;
  *(code **)&this_00[1].field_0x8 = SyncRetFunc0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  sVar2 = SyncRetEventAgent<bool>::send(this_00,(int)this + 8,__buf,0x10a5ac,in_R8D);
  return SUB81(sVar2,0);
}

Assistant:

bool SyncRetFunc0()
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent0<TestClass, bool>* agent =
				jh_new SyncRetEventAgent0<TestClass, bool>(this, &TestClass::SyncRetFunc0);
			result = agent->send(&mEventThread);
			LOG_INFO("SyncRet0 result RetVal(%d)", result);
			return result;
		}
		LOG_INFO("Received");
		return true;
	}